

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * parse_static_assert(dmr_C *C,token *token,symbol_list **unused)

{
  expression *peVar1;
  token *C_00;
  longlong lVar2;
  char *pcVar3;
  position local_38;
  position pos;
  expression *message;
  expression *cond;
  symbol_list **unused_local;
  token *token_local;
  dmr_C *C_local;
  
  message = (expression *)0x0;
  pos = (position)0x0;
  cond = (expression *)unused;
  unused_local = (symbol_list **)token;
  token_local = (token *)C;
  unused_local = (symbol_list **)dmrC_expect_token(C,token->next,0x28,"after _Static_assert");
  unused_local = (symbol_list **)
                 dmrC_conditional_expression((dmr_C *)token_local,(token *)unused_local,&message);
  if (message == (expression *)0x0) {
    dmrC_sparse_error((dmr_C *)token_local,((token *)unused_local)->pos,
                      "Expected constant expression");
  }
  unused_local = (symbol_list **)
                 dmrC_expect_token((dmr_C *)token_local,(token *)unused_local,0x2c,
                                   "after conditional expression in _Static_assert");
  unused_local = (symbol_list **)
                 dmrC_parse_expression
                           ((dmr_C *)token_local,(token *)unused_local,(expression **)&pos);
  if ((pos == (position)0x0) || ((*(ushort *)pos & 0xff) != 2)) {
    if (pos == (position)0x0) {
      local_38 = ((token *)unused_local)->pos;
    }
    else {
      local_38 = *(position *)((long)pos + 8);
    }
    dmrC_sparse_error((dmr_C *)token_local,local_38,"bad or missing string literal");
    message = (expression *)0x0;
  }
  unused_local = (symbol_list **)
                 dmrC_expect_token((dmr_C *)token_local,(token *)unused_local,0x29,
                                   "after diagnostic message in _Static_assert");
  unused_local = (symbol_list **)
                 dmrC_expect_token((dmr_C *)token_local,(token *)unused_local,0x3b,
                                   "after _Static_assert()");
  if (message != (expression *)0x0) {
    lVar2 = dmrC_const_expression_value((dmr_C *)token_local,message);
    C_00 = token_local;
    peVar1 = message;
    if ((lVar2 == 0) &&
       ((undefined1  [64])((undefined1  [64])*message & (undefined1  [64])0xff) ==
        (undefined1  [64])0x1)) {
      pcVar3 = dmrC_show_string((dmr_C *)token_local,*(string **)((long)pos + 0x28));
      dmrC_sparse_error((dmr_C *)C_00,peVar1->pos,"static assertion failed: %s",pcVar3);
    }
  }
  return (token *)unused_local;
}

Assistant:

static struct token *parse_static_assert(struct dmr_C *C, struct token *token, struct symbol_list **unused)
{
        (void) unused;
	struct expression *cond = NULL, *message = NULL;

	token = dmrC_expect_token(C, token->next, '(', "after _Static_assert");
	token = dmrC_constant_expression(C, token, &cond);
	if (!cond)
		dmrC_sparse_error(C, token->pos, "Expected constant expression");
	token = dmrC_expect_token(C, token, ',', "after conditional expression in _Static_assert");
	token = dmrC_parse_expression(C, token, &message);
	if (!message || message->type != EXPR_STRING) {
		struct position pos;

		pos = message ? message->pos : token->pos;
		dmrC_sparse_error(C, pos, "bad or missing string literal");
		cond = NULL;
	}
	token = dmrC_expect_token(C, token, ')', "after diagnostic message in _Static_assert");

	token = dmrC_expect_token(C, token, ';', "after _Static_assert()");

	if (cond && !dmrC_const_expression_value(C, cond) && cond->type == EXPR_VALUE)
		dmrC_sparse_error(C, cond->pos, "static assertion failed: %s",
			     dmrC_show_string(C, message->string));
	return token;
}